

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

void address_space_stq_internal_mipsel
               (uc_struct_conflict5 *uc,AddressSpace *as,hwaddr addr,uint64_t val,MemTxAttrs attrs,
               MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  ulong *puVar2;
  ulong data;
  uint in_register_00000084;
  undefined4 in_stack_0000000c;
  hwaddr l;
  hwaddr local_40;
  hwaddr local_38;
  
  data = CONCAT44(in_register_00000084,attrs);
  local_38 = 8;
  mr = flatview_translate_mipsel(uc,(FlatView *)as,val,&local_40,&local_38,true,SUB84(result,0));
  if (((local_38 < 8) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_mipsel
                      (uc,mr,local_40,data,(uint)((int)l == 1) * 8 + MO_64,SUB84(result,0));
  }
  else {
    puVar2 = (ulong *)qemu_map_ram_ptr_mipsel((uc_struct_conflict5 *)mr->uc,mr->ram_block,local_40);
    if ((int)l == 1) {
      data = (ulong)(in_register_00000084 >> 0x18) |
             (((ulong)in_register_00000084 & 0xff0000) << 0x20) >> 0x28 |
             (((ulong)in_register_00000084 & 0xff00) << 0x20) >> 0x18 |
             (((ulong)in_register_00000084 & 0xff) << 0x20) >> 8 |
             ((ulong)(uint)attrs & 0xff000000) << 8 | ((ulong)(uint)attrs & 0xff0000) << 0x18 |
             ((ulong)(uint)attrs & 0xff00) << 0x28 | data << 0x38;
    }
    *puVar2 = data;
    MVar1 = 0;
  }
  if ((MemTxResult *)CONCAT44(in_stack_0000000c,endian) != (MemTxResult *)0x0) {
    *(MemTxResult *)CONCAT44(in_stack_0000000c,endian) = MVar1;
  }
  return;
}

Assistant:

static void glue(address_space_stq_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint64_t val, MemTxAttrs attrs,
    MemTxResult *result, enum device_endian endian)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 8;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 8 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val,
                                         MO_64 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            stq_le_p(ptr, val);
            break;
        case DEVICE_BIG_ENDIAN:
            stq_be_p(ptr, val);
            break;
        default:
            stq_p(ptr, val);
            break;
        }
        invalidate_and_set_dirty(mr, addr1, 8);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}